

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O2

bool __thiscall
stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>::operator<
          (CoordWithIndex<double,_unsigned_int> *this,CoordWithIndex<double,_unsigned_int> *c)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = this->data[0];
  dVar2 = c->data[0];
  bVar3 = true;
  if (dVar2 <= dVar1) {
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      return false;
    }
    dVar1 = this->data[1];
    dVar2 = c->data[1];
    if (dVar2 <= dVar1) {
      if (dVar1 != dVar2) {
        return false;
      }
      if (NAN(dVar1) || NAN(dVar2)) {
        return false;
      }
      bVar3 = this->data[2] <= c->data[2] && c->data[2] != this->data[2];
    }
  }
  return bVar3;
}

Assistant:

bool operator < (const CoordWithIndex& c) const
    {
      return (data[0] < c[0])
          || (data[0] == c[0] && data[1] < c[1])
          || (data[0] == c[0] && data[1] == c[1] && data[2] < c[2]);
    }